

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::api::HDWalletApi::CreateExtkeyFromParentPath
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type,
          ExtKeyType output_key_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_number_list)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  pointer puVar5;
  uint32_t uVar6;
  uint32_t version;
  string local_1b0;
  ExtPubkey pubkey;
  string errmsg;
  ExtPrivkey privkey;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((child_number_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (child_number_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    privkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdapi_hdwallet.cpp";
    privkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x92;
    privkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CreateExtkeyFromParentPath";
    core::logger::warn<>((CfdSourceLocation *)&privkey,"child_number_list empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&privkey,"child_number_list empty.",(allocator *)&pubkey)
    ;
    core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&privkey);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ExtPrivkey::ExtPrivkey(&privkey);
  core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)&pubkey,extkey);
  core::ExtPrivkey::operator=(&privkey,(ExtPrivkey *)&pubkey);
  core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&pubkey);
  bVar2 = core::ExtPrivkey::IsValid(&privkey);
  if (bVar2) {
    if (output_key_type == kExtPrivkey) {
      core::ExtPrivkey::DerivePrivkey((ExtPrivkey *)&pubkey,&privkey,child_number_list);
      core::ExtPrivkey::ToString_abi_cxx11_(&errmsg,(ExtPrivkey *)&pubkey);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&errmsg);
      std::__cxx11::string::~string((string *)&errmsg);
      core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&pubkey);
    }
    else {
      core::ExtPrivkey::DerivePubkey(&pubkey,&privkey,child_number_list);
      core::ExtPubkey::ToString_abi_cxx11_(&errmsg,&pubkey);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&errmsg);
      std::__cxx11::string::~string((string *)&errmsg);
      core::ExtPubkey::~ExtPubkey(&pubkey);
    }
    uVar3 = core::ExtPrivkey::GetVersion(&privkey);
    uVar6 = 0x4358394;
    if (net_type == kLiquidV1) {
      uVar6 = 0x488ade4;
    }
    version = uVar3;
    if (net_type == kMainnet) {
      uVar6 = 0x488ade4;
    }
  }
  else {
    core::ExtPubkey::ExtPubkey(&pubkey);
    core::ExtPubkey::ExtPubkey((ExtPubkey *)&errmsg,extkey);
    core::ExtPubkey::operator=(&pubkey,(ExtPubkey *)&errmsg);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)&errmsg);
    if (output_key_type == kExtPrivkey) {
      errmsg._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
      errmsg._M_string_length._0_4_ = 0xbc;
      errmsg.field_2._M_allocated_capacity = (long)"CfdCreateExtkeyFromParentPath" + 3;
      core::logger::warn<>
                ((CfdSourceLocation *)&errmsg,
                 "Illegal output_key_type. Cannot create privkey from pubkey.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&errmsg,"Illegal output_key_type. Cannot create privkey from pubkey.",
                 (allocator *)&local_1b0);
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&errmsg);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    puVar5 = (child_number_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    while (puVar5 != (child_number_list->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish) {
      uVar1 = *puVar5;
      puVar5 = puVar5 + 1;
      if ((int)uVar1 < 0) {
        errmsg._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
        errmsg._M_string_length._0_4_ = 0xc6;
        errmsg.field_2._M_allocated_capacity = (long)"CfdCreateExtkeyFromParentPath" + 3;
        core::logger::warn<>
                  ((CfdSourceLocation *)&errmsg,"Illegal child_number. Hardened is privkey only.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&errmsg,"Illegal child_number. Hardened is privkey only.",
                   (allocator *)&local_1b0);
        core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&errmsg);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
    }
    core::ExtPubkey::DerivePubkey((ExtPubkey *)&errmsg,&pubkey,child_number_list);
    core::ExtPubkey::ToString_abi_cxx11_(&local_1b0,(ExtPubkey *)&errmsg);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    core::ExtPubkey::~ExtPubkey((ExtPubkey *)&errmsg);
    uVar3 = core::ExtPubkey::GetVersion(&pubkey);
    uVar6 = 0x43587cf;
    if (net_type == kLiquidV1) {
      uVar6 = 0x488b21e;
    }
    if (net_type == kMainnet) {
      uVar6 = 0x488b21e;
    }
    version = uVar3;
    core::ExtPubkey::~ExtPubkey(&pubkey);
  }
  if (uVar3 == uVar6) {
    core::ExtPrivkey::~ExtPrivkey(&privkey);
    return __return_storage_ptr__;
  }
  pubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdapi_hdwallet.cpp";
  pubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xd2;
  pubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "CreateExtkeyFromParentPath";
  core::logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&pubkey,"Version unmatch. key version: {}",&version);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&pubkey,"extkey networkType unmatch.",(allocator *)&errmsg)
  ;
  core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pubkey);
  __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::CreateExtkeyFromParentPath(
    const std::string& extkey, NetType net_type, ExtKeyType output_key_type,
    const std::vector<uint32_t>& child_number_list) const {
  std::string result;
  uint32_t check_version;
  uint32_t version;

  if (child_number_list.empty()) {
    warn(CFD_LOG_SOURCE, "child_number_list empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "child_number_list empty.");
  }

  ExtPrivkey privkey;
  try {
    privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (privkey.IsValid()) {
    if (output_key_type == ExtKeyType::kExtPrivkey) {
      result = privkey.DerivePrivkey(child_number_list).ToString();
    } else {
      result = privkey.DerivePubkey(child_number_list).ToString();
    }
    version = privkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPrivkey, net_type);

  } else {
    ExtPubkey pubkey;
    try {
      pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }

    if (output_key_type == ExtKeyType::kExtPrivkey) {
      warn(
          CFD_LOG_SOURCE,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Illegal output_key_type. Cannot create privkey from pubkey.");
    }
    for (const uint32_t child_num : child_number_list) {
      // libwallyでもエラー検知されるが、エラーを把握しやすくするため確認
      if ((child_num & ExtPrivkey::kHardenedKey) != 0) {
        warn(
            CFD_LOG_SOURCE, "Illegal child_number. Hardened is privkey only.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal child_number. Hardened is privkey only.");
      }
    }
    result = pubkey.DerivePubkey(child_number_list).ToString();
    version = pubkey.GetVersion();
    check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  }

  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return result;
}